

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
::cni_holder(cni_holder<char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
             *this,_func_char_shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_ptr
                   **func)

{
  function<char_(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)> *in_RDI;
  cni_helper<char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
  *this_00;
  function<char_(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
  *in_stack_ffffffffffffffc0;
  _func_char_shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_ptr *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_006b7be0;
  this_00 = (cni_helper<char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<char(std::shared_ptr<std::istream>&)>::
  function<char(*const&)(std::shared_ptr<std::istream>&),void>(in_stack_ffffffffffffffc0,local_30);
  cni_helper<char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
  ::cni_helper(this_00,in_RDI);
  std::function<char_(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>::
  ~function((function<char_(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
             *)0x499766);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}